

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLog>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  GetterXsYs<unsigned_long_long> *pGVar6;
  TransformerLinLog *pTVar7;
  ImPlotPlot *pIVar8;
  GetterXsYRef<unsigned_long_long> *pGVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  undefined1 auVar12 [12];
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  int iVar15;
  long lVar16;
  ushort uVar17;
  ImDrawIdx IVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  double dVar24;
  ImVec2 IVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar40 [16];
  
  pIVar13 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  iVar15 = pGVar6->Count;
  lVar16 = (long)(((pGVar6->Offset + prim + 1) % iVar15 + iVar15) % iVar15) * (long)pGVar6->Stride;
  uVar1 = *(unsigned_long_long *)((long)pGVar6->Xs + lVar16);
  uVar2 = *(unsigned_long_long *)((long)pGVar6->Ys + lVar16);
  dVar24 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  pIVar14 = GImPlot;
  iVar15 = pTVar7->YAxis;
  pIVar8 = pIVar13->CurrentPlot;
  dVar3 = pIVar8->YAxis[iVar15].Range.Min;
  pGVar9 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar5 = pGVar9->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar9->Xs +
           (long)(((prim + 1 + pGVar9->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar9->Stride);
  IVar4 = pIVar13->PixelRange[iVar15].Min;
  fVar26 = (float)(pIVar13->Mx *
                   ((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) -
                   (pIVar8->XAxis).Range.Min) + (double)IVar4.x);
  fVar28 = (float)(pIVar13->My[iVar15] *
                   (((double)(float)(dVar24 / pIVar13->LogDenY[iVar15]) *
                     (pIVar8->YAxis[iVar15].Range.Max - dVar3) + dVar3) - dVar3) + (double)IVar4.y);
  dVar24 = log10(pGVar9->YRef / GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  iVar15 = pTVar7->YAxis;
  pIVar8 = pIVar14->CurrentPlot;
  dVar3 = pIVar8->YAxis[iVar15].Range.Min;
  IVar4 = pIVar14->PixelRange[iVar15].Min;
  IVar25.x = (float)(pIVar14->Mx *
                     ((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25)
                      + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
                     (pIVar8->XAxis).Range.Min) + (double)IVar4.x);
  IVar25.y = (float)(pIVar14->My[iVar15] *
                     (((double)(float)(dVar24 / pIVar14->LogDenY[iVar15]) *
                       (pIVar8->YAxis[iVar15].Range.Max - dVar3) + dVar3) - dVar3) + (double)IVar4.y
                    );
  fVar27 = (this->P12).x;
  fVar29 = (this->P12).y;
  fVar31 = (this->P11).x;
  fVar32 = (this->P11).y;
  uVar22 = -(uint)(fVar32 < fVar29);
  fVar30 = (float)(~-(uint)(fVar27 <= fVar31) & (uint)fVar27 |
                  (uint)fVar31 & -(uint)(fVar27 <= fVar31));
  fVar33 = (float)(~-(uint)(fVar29 <= fVar32) & (uint)fVar29 |
                  (uint)fVar32 & -(uint)(fVar29 <= fVar32));
  fVar36 = (float)(~-(uint)(fVar31 < fVar27) & (uint)fVar27 |
                  (uint)fVar31 & -(uint)(fVar31 < fVar27));
  fVar44 = (float)(~uVar22 & (uint)fVar29 | (uint)fVar32 & uVar22);
  uVar19 = -(uint)(fVar26 <= fVar30);
  uVar20 = -(uint)(fVar28 <= fVar33);
  uVar21 = -(uint)(fVar36 < fVar26);
  uVar23 = -(uint)(fVar44 < fVar28);
  fVar30 = (float)(~uVar19 & (uint)fVar26 | (uint)fVar30 & uVar19);
  fVar33 = (float)(~uVar20 & (uint)fVar28 | (uint)fVar33 & uVar20);
  fVar36 = (float)(~uVar21 & (uint)fVar26 | (uint)fVar36 & uVar21);
  fVar44 = (float)(~uVar23 & (uint)fVar28 | (uint)fVar44 & uVar23);
  uVar19 = -(uint)(IVar25.x <= fVar30);
  uVar20 = -(uint)(IVar25.y <= fVar33);
  uVar21 = -(uint)(fVar36 < IVar25.x);
  uVar23 = -(uint)(fVar44 < IVar25.y);
  auVar35._0_4_ = (uint)fVar30 & uVar19;
  auVar35._4_4_ = (uint)fVar33 & uVar20;
  auVar35._8_4_ = (uint)fVar36 & uVar21;
  auVar35._12_4_ = (uint)fVar44 & uVar23;
  auVar41._0_4_ = ~uVar19 & (uint)IVar25.x;
  auVar41._4_4_ = ~uVar20 & (uint)IVar25.y;
  auVar41._8_4_ = ~uVar21 & (uint)IVar25.x;
  auVar41._12_4_ = ~uVar23 & (uint)IVar25.y;
  auVar41 = auVar41 | auVar35;
  fVar30 = (cull_rect->Min).y;
  auVar43._4_4_ = -(uint)(fVar30 < auVar41._4_4_);
  auVar43._0_4_ = -(uint)((cull_rect->Min).x < auVar41._0_4_);
  auVar12._4_8_ = auVar41._8_8_;
  auVar12._0_4_ = -(uint)(auVar41._4_4_ < fVar30);
  auVar42._0_8_ = auVar12._0_8_ << 0x20;
  auVar42._8_4_ = -(uint)(auVar41._8_4_ < (cull_rect->Max).x);
  auVar42._12_4_ = -(uint)(auVar41._12_4_ < (cull_rect->Max).y);
  auVar43._8_8_ = auVar42._8_8_;
  iVar15 = movmskps((int)cull_rect,auVar43);
  if (iVar15 == 0xf) {
    fVar33 = fVar28 * fVar31 - fVar32 * fVar26;
    fVar36 = IVar25.y * fVar27 - fVar29 * IVar25.x;
    fVar30 = fVar29 - IVar25.y;
    auVar37._4_4_ = fVar30;
    auVar37._0_4_ = fVar30;
    auVar37._8_4_ = fVar30;
    auVar37._12_4_ = fVar30;
    auVar38._4_12_ = auVar37._4_12_;
    auVar38._0_4_ = fVar30 * (fVar31 - fVar26) - (fVar32 - fVar28) * (fVar27 - IVar25.x);
    auVar34._0_4_ = fVar33 * (fVar27 - IVar25.x) - fVar36 * (fVar31 - fVar26);
    auVar34._4_4_ = fVar33 * fVar30 - fVar36 * (fVar32 - fVar28);
    auVar34._8_4_ = fVar28 * 0.0 - IVar25.y * 0.0;
    auVar34._12_4_ = fVar28 * 0.0 - IVar25.y * 0.0;
    auVar40._0_8_ = auVar38._0_8_;
    auVar40._8_4_ = fVar30;
    auVar40._12_4_ = fVar30;
    auVar39._8_8_ = auVar40._8_8_;
    auVar39._4_4_ = auVar38._0_4_;
    auVar39._0_4_ = auVar38._0_4_;
    auVar35 = divps(auVar34,auVar39);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = this->Col;
    pIVar10[1].pos.x = fVar26;
    pIVar10[1].pos.y = fVar28;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = this->Col;
    pIVar10[2].pos = auVar35._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = this->Col;
    pIVar10[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = this->Col;
    pIVar10[4].pos = IVar25;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar10 + 5;
    uVar19 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar18 = (ImDrawIdx)uVar19;
    *pIVar11 = IVar18;
    uVar17 = (byte)((byte)uVar22 & IVar25.y < fVar28 | -(fVar29 < fVar32) & -(fVar28 < IVar25.y)) &
             1;
    pIVar11[1] = IVar18 + uVar17 + 1;
    pIVar11[2] = IVar18 + 3;
    pIVar11[3] = IVar18 + 1;
    pIVar11[4] = (uVar17 ^ 3) + IVar18;
    pIVar11[5] = IVar18 + 4;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar19 + 5;
  }
  (this->P11).x = fVar26;
  (this->P11).y = fVar28;
  (this->P12).x = IVar25.x;
  (this->P12).y = IVar25.y;
  return (char)iVar15 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }